

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testIntegerToString(int count)

{
  long lVar1;
  int extraout_EDX;
  int value;
  int extraout_EDX_00;
  string local_40;
  int local_1c;
  long lStack_18;
  int i;
  long start;
  int count_local;
  
  start._4_4_ = count + -1;
  lStack_18 = GetTickCount();
  value = extraout_EDX;
  for (local_1c = 0; local_1c <= start._4_4_; local_1c = local_1c + 1) {
    FIX::IntTConvertor<int>::convert_abi_cxx11_(&local_40,(IntTConvertor<int> *)0x4d2,value);
    std::__cxx11::string::~string((string *)&local_40);
    value = extraout_EDX_00;
  }
  lVar1 = GetTickCount();
  return lVar1 - lStack_18;
}

Assistant:

long testIntegerToString(int count) {
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::IntConvertor::convert(1234);
  }
  return GetTickCount() - start;
}